

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

int cal_sigidx(ex_ex *optr,int i,t_float rem_i,int idx,int vsize,t_float *curvec,t_float *prevec)

{
  int iVar1;
  int n;
  t_float *prevec_local;
  t_float *curvec_local;
  int vsize_local;
  int idx_local;
  t_float rem_i_local;
  int i_local;
  ex_ex *optr_local;
  
  iVar1 = i + idx;
  if (iVar1 < 1) {
    if (iVar1 == 0) {
      if ((rem_i != 0.0) || (NAN(rem_i))) {
        (optr->ex_cont).v_flt = rem_i * (*curvec - prevec[vsize + -1]) + *curvec;
      }
      else {
        (optr->ex_cont).v_flt = *curvec;
      }
      optr_local._4_4_ = 0;
    }
    else {
      iVar1 = vsize + iVar1;
      if (iVar1 < 1) {
        (optr->ex_cont).v_flt = *prevec;
        optr_local._4_4_ = 1;
      }
      else {
        if ((rem_i != 0.0) || (NAN(rem_i))) {
          (optr->ex_cont).v_flt = rem_i * (prevec[iVar1] - prevec[iVar1 + -1]) + prevec[iVar1];
        }
        else {
          (optr->ex_cont).v_flt = prevec[iVar1];
        }
        optr_local._4_4_ = 0;
      }
    }
  }
  else {
    if ((rem_i != 0.0) || (NAN(rem_i))) {
      (optr->ex_cont).v_flt = rem_i * (curvec[iVar1] - curvec[iVar1 + -1]) + curvec[iVar1];
    }
    else {
      (optr->ex_cont).v_flt = curvec[iVar1];
    }
    optr_local._4_4_ = 0;
  }
  return optr_local._4_4_;
}

Assistant:

static int
cal_sigidx(struct ex_ex *optr,  /* The output value */
           int i, t_float rem_i,/* integer and fractinal part of index */
           int idx,             /* index of current fexpr~ processing */
           int vsize,           /* vector size */
           t_float *curvec, t_float *prevec)        /* current and previous table */
{
        int n;

        n = i + idx;
        if (n > 0) {
                /* from the curvec */
                if (rem_i)
                        optr->ex_flt = curvec[n] +
                                        rem_i * (curvec[n] - curvec[n - 1]);
                else
                        optr->ex_flt = curvec[n];
                return (0);
        }
        if (n == 0) {
                /*
                 * this is the case that the remaining float
                 * is between two tables
                 */
                if (rem_i)
                        optr->ex_flt = *curvec +
                                        rem_i * (*curvec - prevec[vsize - 1]);
                else
                        optr->ex_flt = *curvec;
                return (0);
        }
        /* find the index in the saved buffer */
        n = vsize + n;
        if (n > 0) {
                if (rem_i)
                        optr->ex_flt = prevec[n] +
                                        rem_i * (prevec[n] - prevec[n - 1]);
                else
                        optr->ex_flt = prevec[n];
                return (0);
        }
        /* out of bound */
        optr->ex_flt = *prevec;
        return (1);
}